

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

ssize_t __thiscall
stream::slice_reader::read(slice_reader *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  long lVar7;
  
  lVar7 = CONCAT44(in_register_00000034,__fd);
  seek(this,this->current_slice);
  uVar6 = 0;
  do {
    if ((long)__buf < 1) break;
    uVar3 = std::istream::tellg();
    if (this->slice_size < uVar3) {
LAB_0014ff33:
      bVar2 = false;
    }
    else {
      if (this->slice_size == uVar3) {
        seek(this,this->current_slice + 1);
        uVar3 = std::istream::tellg();
        if (this->slice_size < uVar3) goto LAB_0014ff33;
      }
      plVar4 = (long *)std::istream::read((char *)this->is,lVar7);
      if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) goto LAB_0014ff33;
      lVar1 = this->is->_M_gcount;
      uVar6 = uVar6 + lVar1;
      lVar7 = lVar7 + lVar1;
      __buf = (void *)((long)__buf - lVar1);
      bVar2 = true;
    }
  } while (bVar2);
  uVar5 = -(ulong)(__buf != (void *)0x0) | uVar6;
  if (uVar6 != 0) {
    uVar5 = uVar6;
  }
  return uVar5;
}

Assistant:

std::streamsize slice_reader::read(char * buffer, std::streamsize bytes) {
	
	seek(current_slice);
	
	std::streamsize nread = 0;
	
	while(bytes > 0) {
		
		boost::uint32_t read_pos = boost::uint32_t(is->tellg());
		if(read_pos > slice_size) {
			break;
		}
		boost::uint32_t remaining = slice_size - read_pos;
		if(!remaining) {
			seek(current_slice + 1);
			read_pos = boost::uint32_t(is->tellg());
			if(read_pos > slice_size) {
				break;
			}
			remaining = slice_size - read_pos;
		}
		
		boost::uint64_t toread = std::min(boost::uint64_t(remaining), boost::uint64_t(bytes));
		toread = std::min(toread, boost::uint64_t(std::numeric_limits<std::streamsize>::max()));
		if(is->read(buffer, std::streamsize(toread)).fail()) {
			break;
		}
		
		std::streamsize read = is->gcount();
		nread += read, buffer += read, bytes -= read;
	}
	
	return (nread != 0 || bytes == 0) ? nread : -1;
}